

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linkedlist_dump_dotgraph.c
# Opt level: O2

void linkedlist_dump_dotgraph
               (s_linkedlist *linked_list,_func_char_ptr_void_ptr *fun_render_node_element,
               int file_desc)

{
  s_linkedlist_node *psVar1;
  int iVar2;
  char *__ptr;
  s_linkedlist_node *psVar3;
  char *local_38;
  char *buffer;
  
  psVar1 = linked_list->head;
  local_38 = (char *)0x0;
  write(file_desc,"digraph linkedlist {\n",0x15);
  while (psVar3 = psVar1, psVar3 != (s_linkedlist_node *)0x0) {
    if (fun_render_node_element == (_func_char_ptr_void_ptr *)0x0) {
      iVar2 = asprintf(&local_38,"\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n",psVar3,psVar3);
      write(file_desc,local_38,(long)iVar2);
      __ptr = local_38;
    }
    else {
      __ptr = (*fun_render_node_element)(psVar3->element);
      iVar2 = asprintf(&local_38,"\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n",psVar3,psVar3,__ptr);
      write(file_desc,local_38,(long)iVar2);
      free(local_38);
    }
    free(__ptr);
    if (psVar3->previous != (s_linkedlist_node *)0x0) {
      iVar2 = asprintf(&local_38,"\"%p\" -> \"%p\";\n",psVar3);
      write(file_desc,local_38,(long)iVar2);
      free(local_38);
    }
    psVar1 = (s_linkedlist_node *)0x0;
    if (psVar3->next != (s_linkedlist_node *)0x0) {
      iVar2 = asprintf(&local_38,"\"%p\" -> \"%p\";\n",psVar3);
      write(file_desc,local_38,(long)iVar2);
      free(local_38);
      psVar1 = psVar3->next;
    }
  }
  write(file_desc,"}\n",2);
  return;
}

Assistant:

void linkedlist_dump_dotgraph(s_linkedlist *linked_list, char *(*fun_render_node_element)(void *), int file_desc) {
    s_linkedlist_node *node   = linked_list->head;
    char              *buffer = NULL;
    int               len     = 0;

    write(file_desc, "digraph linkedlist {\n", 21);
    while (node != NULL) {
        if (fun_render_node_element != NULL) {
            char *element = fun_render_node_element(node->element);
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%s\"];\n", node, node, element);
            write(file_desc, buffer, len);

            free(buffer);
            if (element != NULL) {
                free(element);
            }
        } else {
            len = asprintf(&buffer, "\"%p\" [shape=box label=\"<%p>\n\n%p\"];\n", node, node, node->element);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->previous != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->previous);
            write(file_desc, buffer, len);

            free(buffer);
        }

        if (node->next != NULL) {
            len = asprintf(&buffer, "\"%p\" -> \"%p\";\n", node, node->next);
            write(file_desc, buffer, len);

            free(buffer);
        }

        node = node->next;
    }

    write(file_desc, "}\n", 2);
}